

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_0::PreservingSwapTest::init(PreservingSwapTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  NativeDisplay *pNVar1;
  Visibility VVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLenum err;
  EGLDisplay pvVar6;
  Library *pLVar7;
  EGLConfig pvVar8;
  NativeWindowFactory *pNVar9;
  undefined4 extraout_var;
  EGLSurface pvVar10;
  undefined4 extraout_var_00;
  GLES2Program *pGVar11;
  ReferenceProgram *pRVar12;
  NotSupportedError *this_00;
  allocator<char> local_14a;
  allocator<char> local_149;
  string local_148;
  string local_128;
  EGLint attribList [3];
  undefined4 uStack_fc;
  
  pvVar6 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar6;
  pLVar7 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  attribList._0_8_ = CONCAT44((uint)this->m_preserveColorbuffer << 10,0x3033) | 0x400000000;
  stack0xffffffffffffff00 = (pointer)0x400003040;
  pvVar8 = eglu::chooseSingleConfig(pLVar7,this->m_eglDisplay,attribList);
  this->m_eglConfig = pvVar8;
  if (pvVar8 != (EGLConfig)0x0) {
    pNVar9 = eglu::selectNativeWindowFactory
                       (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine)
    ;
    pvVar6 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    VVar2 = eglu::parseWindowVisibility
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    attribList[0] = 0x1e0;
    attribList[1] = 0x1e0;
    attribList[2] = VVar2;
    iVar3 = (*(pNVar9->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar9,pNVar1,pvVar6,pvVar8,0,attribList);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar3);
    pvVar10 = eglu::createWindowSurface
                        ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                         super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                         .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar3),this->m_eglDisplay
                         ,pvVar8,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar10;
    pvVar8 = this->m_eglConfig;
    pLVar7 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    attribList[0] = 0x3098;
    attribList[1] = 2;
    stack0xffffffffffffff00 = (pointer)CONCAT44(uStack_fc,0x3038);
    (**pLVar7->_vptr_Library)(pLVar7,0x30a0);
    iVar3 = (*pLVar7->_vptr_Library[6])(pLVar7,this->m_eglDisplay,pvVar8,0,attribList);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar3);
    dVar4 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar4,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x15c);
    (*pLVar7->_vptr_Library[0x27])
              (pLVar7,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar4 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar4,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x160);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pGVar11 = (GLES2Program *)operator_new(0xe0);
    pGVar11->m_gl = dst;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,
               "attribute mediump vec4 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = a_pos;\n}"
               ,&local_149);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,
               "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",
               &local_14a);
    glu::makeVtxFragSources((ProgramSources *)attribList,&local_128,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    glu::ShaderProgram::ShaderProgram(&pGVar11->m_glProgram,dst,(ProgramSources *)attribList);
    glu::ProgramSources::~ProgramSources((ProgramSources *)attribList);
    pGVar11->m_coordLoc = 0xffffffff;
    pGVar11->m_colorLoc = 0xffffffff;
    GVar5 = (*pGVar11->m_gl->getAttribLocation)
                      ((pGVar11->m_glProgram).m_program.m_program,"a_color");
    pGVar11->m_colorLoc = GVar5;
    GVar5 = (*pGVar11->m_gl->getAttribLocation)((pGVar11->m_glProgram).m_program.m_program,"a_pos");
    pGVar11->m_coordLoc = GVar5;
    err = (*pGVar11->m_gl->getError)();
    glu::checkError(err,"Failed to get attribute locations",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                    ,0x99);
    this->m_gles2Program = pGVar11;
    pRVar12 = (ReferenceProgram *)operator_new(1);
    this->m_refProgram = pRVar12;
    return (int)pRVar12;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No supported config found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
             ,0x169);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PreservingSwapTest::init (void)
{
	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorbuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_gles2Program	= new GLES2Program(m_gl);
	m_refProgram	= new ReferenceProgram();
}